

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O1

void envy_bios_print_bit_P(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_power *power;
  ushort uVar1;
  uint8_t *puVar2;
  int offset;
  envy_bios_bit_entry *peVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  char *name;
  char *local_38;
  
  peVar3 = (bios->power).bit;
  if ((mask >> 10 & 1) != 0 && peVar3 != (envy_bios_bit_entry *)0x0) {
    power = &bios->power;
    fprintf((FILE *)out,"BIT table \'P\' at 0x%x, version %i\n",(ulong)peVar3->offset,
            (ulong)peVar3->version);
    peVar3 = power->bit;
    if (peVar3->t_len != 0) {
      uVar5 = 0;
      do {
        uVar1 = peVar3->t_offset;
        uVar4 = (ulong)uVar1;
        uVar7 = uVar4 + uVar5 + 3;
        if ((uint)uVar7 < bios->length) {
          puVar2 = bios->data;
          offset = (int)uVar5;
          uVar6 = CONCAT13(puVar2[uVar7 & 0xffffffff],
                           CONCAT12(puVar2[(uint)uVar1 + offset + 2],
                                    CONCAT11(puVar2[(uint)uVar1 + offset + 1],puVar2[uVar5 + uVar4])
                                   ));
          if (uVar6 != 0) {
            local_38 = "UNKNOWN";
            parse_at(bios,power,-1,offset,&local_38);
            fprintf((FILE *)out,"0x%02x: 0x%x => %s TABLE\n",uVar5 & 0xffffffff,(ulong)uVar6,
                    local_38);
          }
        }
        else {
          fprintf(_stderr,"requested OOB u32 at 0x%04x\n",uVar4 + uVar5);
        }
        peVar3 = power->bit;
        uVar5 = uVar5 + 4;
      } while ((uint)uVar5 < (uint)peVar3->t_len);
    }
    fputc(10,(FILE *)out);
  }
  return;
}

Assistant:

void envy_bios_print_bit_P (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power *power = &bios->power;
	const char *name;
	uint32_t addr;
	int ret = 0, i = 0;
	
	if (!power->bit || !(mask & ENVY_BIOS_PRINT_PERF))
		return;

	fprintf(out, "BIT table 'P' at 0x%x, version %i\n", 
		power->bit->offset, power->bit->version);

	for (i = 0; i < power->bit->t_len; i+=4) {
		ret = bios_u32(bios, power->bit->t_offset + i, &addr);
		if (!ret && addr) {
			name = "UNKNOWN";
			ret = parse_at(bios, power, -1, i, &name);
			fprintf(out, "0x%02x: 0x%x => %s TABLE\n", i, addr, name);
		}
	}
	
	fprintf(out, "\n");
}